

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_solver_utilities.cpp
# Opt level: O3

void __thiscall
solver_utilites_compute_residual_Test::~solver_utilites_compute_residual_Test
          (solver_utilites_compute_residual_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(solver_utilites, compute_residual) {

  Matrix_Sparse matrix_sparse(5, 5);

  matrix_sparse[0][0] = 0.5;
  matrix_sparse[1][1] = 0.5;
  matrix_sparse[2][2] = 0.5;
  matrix_sparse[3][3] = 0.5;
  matrix_sparse[4][4] = 0.5;
  Vector_Dense<Scalar, 0> solution;
  solution.resize(5, 2.0);

  Vector_Dense<Scalar, 0> constant = {3.0, -1.0, 3.0, -1.0, 3.0};
  auto [weighted_l2_norm, l_inf_norm] = compute_residual(matrix_sparse, solution, constant);
  EXPECT_DOUBLE_EQ(weighted_l2_norm, 2.0);
  EXPECT_DOUBLE_EQ(l_inf_norm, 2.0);

  constant = Vector_Dense<Scalar, 0>({2.0, 0.0, 3.0, 0.0, 2.0});
  std::tie(weighted_l2_norm, l_inf_norm) = compute_residual(matrix_sparse, solution, constant);
  EXPECT_DOUBLE_EQ(weighted_l2_norm, std::sqrt(8.0 / 5.0));
  EXPECT_DOUBLE_EQ(l_inf_norm, 2.0);

  EXPECT_DEATH(compute_residual(Matrix_Sparse(5, 2), solution, constant), ".*");
  EXPECT_DEATH(compute_residual(Matrix_Sparse(1, 5), solution, constant), ".*");
  EXPECT_DEATH(compute_residual(Matrix_Sparse(1, 1), Vector_Dense<Scalar, 0>{}, constant), ".*");
  EXPECT_DEATH(compute_residual(Matrix_Sparse(1, 1), solution, Vector_Dense<Scalar, 0>{}), ".*");
}